

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableSpiAnalyzer.cpp
# Opt level: O1

void __thiscall EnrichableSpiAnalyzer::Setup(EnrichableSpiAnalyzer *this)

{
  EnrichableSpiAnalyzerSettings *pEVar1;
  char cVar2;
  AnalyzerChannelData *pAVar3;
  Channel local_30 [16];
  
  pEVar1 = (this->mSettings)._M_ptr;
  this->mArrowMarker =
       (pEVar1->mDataValidEdge == LeadingEdge) != (pEVar1->mClockInactiveState == BIT_LOW) | UpArrow
  ;
  Channel::Channel(local_30,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  cVar2 = Channel::operator!=(&pEVar1->mMosiChannel,local_30);
  Channel::~Channel(local_30);
  if (cVar2 == '\0') {
    pAVar3 = (AnalyzerChannelData *)0x0;
  }
  else {
    pAVar3 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  }
  this->mMosi = pAVar3;
  pEVar1 = (this->mSettings)._M_ptr;
  Channel::Channel(local_30,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  cVar2 = Channel::operator!=(&pEVar1->mMisoChannel,local_30);
  Channel::~Channel(local_30);
  if (cVar2 == '\0') {
    pAVar3 = (AnalyzerChannelData *)0x0;
  }
  else {
    pAVar3 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  }
  this->mMiso = pAVar3;
  pAVar3 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mClock = pAVar3;
  pEVar1 = (this->mSettings)._M_ptr;
  Channel::Channel(local_30,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  cVar2 = Channel::operator!=(&pEVar1->mEnableChannel,local_30);
  Channel::~Channel(local_30);
  if (cVar2 == '\0') {
    pAVar3 = (AnalyzerChannelData *)0x0;
  }
  else {
    pAVar3 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  }
  this->mEnable = pAVar3;
  return;
}

Assistant:

void EnrichableSpiAnalyzer::Setup()
{
	bool allow_last_trailing_clock_edge_to_fall_outside_enable = false;
	if( mSettings->mDataValidEdge == AnalyzerEnums::LeadingEdge )
		allow_last_trailing_clock_edge_to_fall_outside_enable = true;

	if( mSettings->mClockInactiveState == BIT_LOW )
	{
		if( mSettings->mDataValidEdge == AnalyzerEnums::LeadingEdge )
			mArrowMarker = AnalyzerResults::UpArrow;
		else
			mArrowMarker = AnalyzerResults::DownArrow;

	}else
	{
		if( mSettings->mDataValidEdge == AnalyzerEnums::LeadingEdge )
			mArrowMarker = AnalyzerResults::DownArrow;
		else
			mArrowMarker = AnalyzerResults::UpArrow;
	}


	if( mSettings->mMosiChannel != UNDEFINED_CHANNEL )
		mMosi = GetAnalyzerChannelData( mSettings->mMosiChannel );
	else
		mMosi = NULL;

	if( mSettings->mMisoChannel != UNDEFINED_CHANNEL )
		mMiso = GetAnalyzerChannelData( mSettings->mMisoChannel );
	else
		mMiso = NULL;


	mClock = GetAnalyzerChannelData( mSettings->mClockChannel );

	if( mSettings->mEnableChannel != UNDEFINED_CHANNEL )
		mEnable = GetAnalyzerChannelData( mSettings->mEnableChannel );
	else
		mEnable = NULL;

}